

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxvolume.cc
# Opt level: O1

Int __thiscall ipx::Maxvolume::Driver(Maxvolume *this,Basis *basis,Slice *slice)

{
  int iVar1;
  int iVar2;
  Int jb;
  double *pdVar3;
  _Bit_type *p_Var4;
  double *pdVar5;
  pointer piVar6;
  pointer piVar7;
  double *pdVar8;
  pointer pdVar9;
  Maxvolume *pMVar10;
  _Alloc_hider _Var11;
  bool bVar12;
  bool bVar13;
  Int IVar14;
  Int IVar15;
  Model *pMVar16;
  ostream *poVar17;
  char *pcVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  Basis *this_00;
  long lVar22;
  fmtflags floatfield;
  ulong uVar23;
  long lVar24;
  char *pcVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  initializer_list<int> __l;
  bool exchanged;
  double local_f0;
  allocator_type local_e1;
  char *local_e0;
  IndexedVector *local_d8;
  Basis *local_d0;
  Maxvolume *local_c8;
  IndexedVector *local_c0;
  ulong local_b8;
  ipxint local_ac;
  string local_a8;
  int local_80;
  uint local_7c;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  ulong local_48;
  double local_40;
  Vector *local_38;
  
  local_d0 = basis;
  pMVar16 = Basis::model(basis);
  iVar1 = pMVar16->num_rows_;
  iVar2 = pMVar16->num_cols_;
  dVar26 = (this->control_->parameters_).super_ipx_parameters.volume_tol;
  local_40 = 1.0;
  if (1.0 <= dVar26) {
    local_40 = dVar26;
  }
  local_ac = (this->control_->parameters_).super_ipx_parameters.maxskip_updates;
  if (0 < (long)iVar1) {
    pdVar3 = (slice->invscale_basic)._M_data;
    p_Var4 = (slice->tblrow_used).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    pdVar5 = (slice->work)._M_data;
    uVar21 = 0;
    do {
      if ((p_Var4[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0) {
        dVar26 = 0.0;
      }
      else {
        dVar26 = pdVar3[uVar21];
      }
      pdVar5[uVar21] = dVar26;
      uVar21 = uVar21 + 1;
    } while ((long)iVar1 != uVar21);
  }
  local_c8 = this;
  Basis::SolveDense(local_d0,&slice->work,&slice->work,'T');
  uVar19 = iVar2 + iVar1;
  if (uVar19 != 0 && SCARRY4(iVar2,iVar1) == (int)uVar19 < 0) {
    pdVar3 = (slice->colscale)._M_data;
    pdVar5 = (slice->colweights)._M_data;
    piVar6 = (pMVar16->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (pMVar16->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (slice->work)._M_data;
    pdVar9 = (pMVar16->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar21 = 0;
    do {
      dVar26 = pdVar3[uVar21];
      dVar27 = 0.0;
      if ((dVar26 != 0.0) || (NAN(dVar26))) {
        iVar1 = piVar6[uVar21];
        lVar24 = (long)iVar1;
        iVar2 = piVar6[uVar21 + 1];
        if (iVar1 < iVar2) {
          do {
            dVar27 = dVar27 + pdVar8[piVar7[lVar24]] * pdVar9[lVar24];
            lVar24 = lVar24 + 1;
          } while (iVar2 != lVar24);
        }
        dVar27 = dVar26 * dVar27;
      }
      pdVar5[uVar21] = dVar27;
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar19);
  }
  local_38 = &slice->invscale_basic;
  local_d8 = &slice->lhs;
  local_c0 = &slice->row;
  pcVar25 = (char *)0x0;
  local_b8 = 0;
  IVar14 = 0;
  pcVar18 = (char *)0x0;
  do {
    if (pcVar18 == pcVar25) {
      uVar19 = (uint)(slice->colweights)._M_size;
      if ((int)uVar19 < 1) {
        local_80 = 0;
        local_7c = 0;
      }
      else {
        dVar27 = 0.0;
        uVar21 = 0;
        local_7c = 0;
        uVar20 = 0;
        dVar26 = 0.0;
        do {
          dVar28 = ABS((slice->colweights)._M_data[uVar21]);
          if (dVar28 <= dVar27) {
            if (dVar26 < dVar28) {
              uVar20 = uVar21 & 0xffffffff;
              dVar26 = dVar28;
            }
          }
          else {
            uVar20 = (ulong)local_7c;
            dVar26 = dVar27;
            dVar27 = dVar28;
            local_7c = (uint)uVar21;
          }
          local_80 = (int)uVar20;
          uVar21 = uVar21 + 1;
        } while ((uVar19 & 0x7fffffff) != uVar21);
      }
      __l._M_len = 2;
      __l._M_array = &local_80;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_a8,__l,&local_e1);
      pcVar25 = (char *)local_a8._M_string_length;
      _Var11._M_p = local_a8._M_dataplus._M_p;
      local_a8._M_dataplus._M_p = (char *)0x0;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      if (pcVar18 != (char *)0x0) {
        operator_delete(pcVar18);
      }
      if (local_a8._M_dataplus._M_p != (char *)0x0) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      local_e0 = _Var11._M_p;
      pcVar18 = local_e0;
    }
    local_e0 = pcVar18;
    iVar1 = *(int *)(pcVar25 + -4);
    dVar26 = (slice->colweights)._M_data[iVar1];
    bVar12 = true;
    if (((dVar26 != 0.0) || (NAN(dVar26))) &&
       (IVar14 = Control::InterruptCheck(local_c8->control_,-1), IVar14 == 0)) {
      this_00 = local_d0;
      Basis::SolveForUpdate(local_d0,iVar1,local_d8);
      IVar15 = ScaleFtran((Maxvolume *)this_00,(slice->colscale)._M_data[iVar1],local_38,local_d8);
      uVar21 = (ulong)IVar15;
      local_78 = ABS((slice->lhs).elements_._M_data[uVar21]);
      uStack_70 = 0;
      if (local_78 <= local_40) {
        pcVar25 = pcVar25 + -4;
        IVar14 = 0;
        (slice->colweights)._M_data[iVar1] = 0.0;
        (slice->colscale)._M_data[iVar1] = 0.0;
        bVar12 = local_ac <= (int)local_b8 && -1 < local_ac;
        local_b8 = (ulong)((int)local_b8 + 1);
      }
      else {
        bVar12 = IndexedVector::sparse(local_d8);
        if (bVar12) {
          lVar24 = (long)(slice->lhs).nnz_;
          if (lVar24 < 1) {
LAB_003ac56b:
            local_f0 = 0.0;
          }
          else {
            local_f0 = 0.0;
            lVar22 = 0;
            do {
              uVar23 = (ulong)(slice->lhs).pattern_.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar22];
              uVar20 = uVar23 + 0x3f;
              if (-1 < (long)uVar23) {
                uVar20 = uVar23;
              }
              if (((slice->tblrow_used).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar20 >> 6) +
                    (ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff
                   ] >> (uVar23 & 0x3f) & 1) != 0) {
                local_f0 = local_f0 + (slice->lhs).elements_._M_data[uVar23];
              }
              lVar22 = lVar22 + 1;
            } while (lVar24 != lVar22);
          }
        }
        else {
          uVar19 = (uint)(local_d8->elements_)._M_size;
          if ((int)uVar19 < 1) goto LAB_003ac56b;
          local_f0 = 0.0;
          uVar20 = 0;
          do {
            if (((slice->tblrow_used).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar20 >> 6] >>
                 (uVar20 & 0x3f) & 1) != 0) {
              local_f0 = local_f0 + (slice->lhs).elements_._M_data[uVar20];
            }
            uVar20 = uVar20 + 1;
          } while ((uVar19 & 0x7fffffff) != uVar20);
        }
        jb = (local_d0->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar21];
        floatfield = _S_boolalpha;
        Basis::TableauRow(local_d0,jb,local_d8,local_c0,true);
        local_68 = (slice->row).elements_._M_data[iVar1];
        uStack_60 = 0;
        local_58 = ABS(local_68);
        uStack_50 = 0;
        if (local_58 < 0.001) {
          poVar17 = Control::Debug(local_c8->control_,3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17," |pivot| ",9);
          Format_abi_cxx11_(&local_a8,(ipx *)0x0,local_58,2,0x100,floatfield);
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar17,local_a8._M_dataplus._M_p,local_a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"(maxvolume)\n",0xc);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
        }
        IVar14 = Basis::ExchangeIfStable(local_d0,jb,iVar1,local_68,0,(bool *)&local_a8);
        pMVar10 = local_c8;
        bVar12 = IVar14 != 0;
        if ((!bVar12) && ((char)local_a8._M_dataplus._M_p == '\x01')) {
          local_c8->updates_ = local_c8->updates_ + 1;
          dVar26 = log2(local_78);
          pMVar10->volinc_ = dVar26 + pMVar10->volinc_;
          pdVar3 = (slice->colscale)._M_data;
          pdVar5 = (slice->invscale_basic)._M_data;
          local_58 = pdVar5[uVar21];
          local_68 = local_68 * pdVar3[iVar1];
          pdVar3[jb] = 1.0 / local_58;
          pdVar5[uVar21] = 1.0 / pdVar3[iVar1];
          uVar20 = uVar21 + 0x3f;
          if (-1 < (long)uVar21) {
            uVar20 = uVar21;
          }
          pdVar3[iVar1] = 0.0;
          uVar23 = (ulong)((uVar21 & 0x800000000000003f) < 0x8000000000000001);
          local_48 = 1L << ((byte)IVar15 & 0x3f);
          local_78 = 1.0;
          if (((slice->tblrow_used).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar20 >> 6) + uVar23 + 0xffffffffffffffff] >> (uVar21 & 0x3f) & 1) == 0) {
            local_78 = 0.0;
          }
          bVar13 = IndexedVector::sparse(local_c0);
          dVar26 = (local_78 - local_f0) / local_68;
          if (bVar13) {
            lVar24 = (long)(slice->row).nnz_;
            if (0 < lVar24) {
              piVar6 = (slice->row).pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar3 = (slice->row).elements_._M_data;
              pdVar5 = (slice->colscale)._M_data;
              pdVar8 = (slice->colweights)._M_data;
              lVar22 = 0;
              do {
                iVar2 = piVar6[lVar22];
                pdVar8[iVar2] = pdVar3[iVar2] * dVar26 * pdVar5[iVar2] + pdVar8[iVar2];
                lVar22 = lVar22 + 1;
              } while (lVar24 != lVar22);
            }
          }
          else {
            uVar19 = (uint)(local_c0->elements_)._M_size;
            if (0 < (int)uVar19) {
              pdVar3 = (slice->row).elements_._M_data;
              pdVar5 = (slice->colscale)._M_data;
              pdVar8 = (slice->colweights)._M_data;
              uVar21 = 0;
              do {
                pdVar8[uVar21] = pdVar3[uVar21] * dVar26 * pdVar5[uVar21] + pdVar8[uVar21];
                uVar21 = uVar21 + 1;
              } while ((uVar19 & 0x7fffffff) != uVar21);
            }
          }
          dVar27 = 1.0;
          if (((slice->tblrow_used).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar20 >> 6) + uVar23 + 0xffffffffffffffff] & local_48) == 0) {
            dVar27 = 0.0;
          }
          pdVar3 = (slice->colweights)._M_data;
          pdVar3[jb] = dVar26 / local_58 + dVar27;
          pdVar3[iVar1] = 0.0;
          pcVar25 = local_e0;
        }
      }
    }
    pcVar18 = local_e0;
    if (bVar12) {
      local_c8->skipped_ = local_c8->skipped_ + (int)local_b8;
      if (local_e0 != (char *)0x0) {
        operator_delete(local_e0);
      }
      return IVar14;
    }
  } while( true );
}

Assistant:

Int Maxvolume::Driver(Basis& basis, Slice& slice) {
    const Model& model = basis.model();
    const Int m = model.rows();
    const Int n = model.cols();
    const SparseMatrix& AI = model.AI();
    Int errflag = 0;

    const double volumetol = std::max(control_.volume_tol(), 1.0);
    const Int maxskip = control_.maxskip_updates();

    Vector& colscale = slice.colscale;
    Vector& invscale_basic = slice.invscale_basic;
    const std::vector<bool>& tblrow_used = slice.tblrow_used;
    Vector& colweights = slice.colweights;
    IndexedVector& lhs = slice.lhs;
    IndexedVector& row = slice.row;
    Vector& work = slice.work;

    // Compute column weights.
    for (Int p = 0; p < m; p++)
        work[p] = tblrow_used[p] ? invscale_basic[p] : 0.0;
    basis.SolveDense(work, work, 'T');
    for (Int j = 0; j < n+m; j++) {
        if (colscale[j]) {
            assert(basis.StatusOf(j) == Basis::NONBASIC);
            double sum = DotColumn(AI, j, work);
            colweights[j] = sum * colscale[j];
        }
        else
            colweights[j] = 0.0;
    }

    std::vector<Int> candidates;
    Int skipped = 0;
    while (true) {
        // Pick column with maximum weight.
        if (candidates.empty()) {
            candidates = FindLargest(colweights);
            assert(!candidates.empty());
        }
        Int jn = candidates.back();
        assert(jn >= 0 && jn < n+m);
        const double weight = colweights[jn];
        if (weight == 0.0)
            break;
        assert(basis.StatusOf(jn) == Basis::NONBASIC);
        assert(colscale[jn] > 0.0);

        if ((errflag = control_.InterruptCheck()) != 0)
            break;

        // Find maximum scaled FTRAN entry.
        basis.SolveForUpdate(jn, lhs);
        const Int pmax = ScaleFtran(colscale[jn], invscale_basic, lhs);
        const double scaled_pivot = lhs[pmax];
        const double vmax = std::abs(scaled_pivot);

        // Skip the column if exchange does not increase volume enough.
        if (vmax <= volumetol) {
            colweights[jn] = 0.0;
            colscale[jn] = 0.0;
            candidates.pop_back();
            if (++skipped > maxskip && maxskip >= 0)
                break;
            continue;
        }

        // Recompute column weight from FTRAN.
        double weight_recomp = 0.0;
        auto sum_used =  [&](Int p, double x) {
            if (tblrow_used[p])
                weight_recomp += x;
        };
        for_each_nonzero(lhs, sum_used);
        assert(std::isfinite(weight_recomp));

        // Update basis.
        const Int jb = basis[pmax];
        basis.TableauRow(jb, lhs, row, true);
        const double pivot = row[jn];
        if (std::abs(pivot) < 1e-3) {
            control_.Debug(3)
                << " |pivot| " << sci2(std::abs(pivot))
                << "(maxvolume)\n";
        }
        bool exchanged;
        errflag = basis.ExchangeIfStable(jb, jn, pivot, 0, &exchanged);
        if (errflag)
            break;
        if (!exchanged)         // factorization was unstable, try again
            continue;
        updates_++;
        volinc_ += std::log2(vmax);

        // Update colscale and invscale_basic.
        const double dn = colscale[jn];
        const double dbinv = invscale_basic[pmax];
        assert(colscale[jb] == 0.0);
        colscale[jb] = 1.0 / invscale_basic[pmax];
        invscale_basic[pmax] = 1.0 / colscale[jn];
        colscale[jn] = 0.0;
        assert(std::isfinite(colscale[jb]));
        assert(std::isfinite(invscale_basic[pmax]));

        // Update column weights.
        const double alpha = (tblrow_used[pmax] - weight_recomp) / (dn*pivot);
        assert(std::isfinite(alpha));
        auto add = [&](Int j, double x) {
            colweights[j] += alpha * x * colscale[j];
        };
        for_each_nonzero(row, add);
        colweights[jb] = tblrow_used[pmax] + alpha/dbinv;
        colweights[jn] = 0.0;
        candidates.clear();
    }

    skipped_ += skipped;
    return errflag;
}